

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

void Fxu_HeapSingleCheck(Fxu_HeapSingle *p)

{
  bool bVar1;
  Fxu_Single *local_18;
  Fxu_Single *pSingle;
  Fxu_HeapSingle *p_local;
  
  p->i = 1;
  while( true ) {
    bVar1 = false;
    if (p->i <= p->nItems) {
      local_18 = p->pTree[p->i];
      bVar1 = local_18 != (Fxu_Single *)0x0;
    }
    if (!bVar1) break;
    if (local_18->HNum != p->i) {
      __assert_fail("pSingle->HNum == p->i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapS.c"
                    ,0xa0,"void Fxu_HeapSingleCheck(Fxu_HeapSingle *)");
    }
    Fxu_HeapSingleCheckOne(p,local_18);
    p->i = p->i + 1;
  }
  return;
}

Assistant:

void Fxu_HeapSingleCheck( Fxu_HeapSingle * p )
{
    Fxu_Single * pSingle;
    Fxu_HeapSingleForEachItem( p, pSingle )
    {
        assert( pSingle->HNum == p->i );
        Fxu_HeapSingleCheckOne( p, pSingle );
    }
}